

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio.c
# Opt level: O1

int fbackupfile(char *fn)

{
  int iVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  int *piVar7;
  char *pcVar8;
  char cVar9;
  long lVar10;
  char cVar11;
  ulong uVar12;
  char local_2168 [8];
  char buf [8192];
  timespec new_times [2];
  undefined1 local_d0 [8];
  stat sb;
  char *tname;
  char *nname;
  
  iVar2 = stat(fn,(stat *)local_d0);
  if (iVar2 == -1) {
    dobeep();
    piVar7 = __errno_location();
    pcVar8 = strerror(*piVar7);
    ewprintf("Can\'t stat %s : %s",fn,pcVar8);
    return 0;
  }
  if ((((bkupdir == (char *)0x0) || (iVar2 = stat(bkupdir,(stat *)(buf + 0x1ff8)), iVar2 != 0)) ||
      (((uint)new_times[1].tv_sec & 0xf000) != 0x4000)) ||
     ((leavetmp != 0 && (iVar2 = strncmp(fn,"/tmp",4), iVar2 == 0)))) {
    pcVar8 = strndup(fn,0x400);
    tname = pcVar8;
    if (pcVar8 == (char *)0x0) {
LAB_00110b03:
      pcVar8 = (char *)0x0;
    }
  }
  else {
    pcVar8 = bkupdir;
    cVar11 = *fn;
    uVar12 = 0;
    if (cVar11 != '\0') {
      sVar4 = strlen(bkupdir);
      pcVar5 = fn + 1;
      do {
        iVar2 = (int)uVar12;
        if (0x3ff - (int)sVar4 <= iVar2) goto LAB_00110b03;
        cVar9 = '!';
        if ((cVar11 != '/') && (cVar9 = cVar11, cVar11 == '!')) {
          if (0x3fe - (int)sVar4 <= iVar2) goto LAB_00110b03;
          lVar10 = (long)iVar2;
          iVar2 = iVar2 + 1;
          local_2168[lVar10] = '!';
          cVar9 = '!';
        }
        local_2168[iVar2] = cVar9;
        uVar12 = (ulong)(iVar2 + 1U);
        cVar11 = *pcVar5;
        pcVar5 = pcVar5 + 1;
      } while (cVar11 != '\0');
      uVar12 = (ulong)(int)(iVar2 + 1U);
    }
    local_2168[uVar12] = '\0';
    iVar2 = asprintf(&tname,"%s/%s",pcVar8,local_2168);
    pcVar8 = tname;
    if (iVar2 == -1) {
      pcVar8 = (char *)0x0;
    }
  }
  if (pcVar8 == (char *)0x0) {
LAB_00110cf5:
    iVar2 = 0;
  }
  else {
    iVar2 = asprintf(&tname,"%s~",pcVar8);
    if (iVar2 == -1) {
      dobeep();
      piVar7 = __errno_location();
      pcVar5 = strerror(*piVar7);
      ewprintf("Can\'t allocate backup file name : %s",pcVar5);
    }
    else {
      iVar2 = asprintf((char **)(sb.__glibc_reserved + 2),"%s.XXXXXXXXXX",pcVar8);
      if (iVar2 != -1) {
        free(pcVar8);
        iVar2 = open(fn,0);
        if (iVar2 == -1) {
          free(tname);
          free((void *)sb.__glibc_reserved[2]);
          return 0;
        }
        iVar3 = mkstemp((char *)sb.__glibc_reserved[2]);
        if (iVar3 != -1) {
          do {
            sVar4 = read(iVar2,local_2168,0x2000);
            if ((long)sVar4 < 1) goto LAB_00110bbc;
            sVar6 = write(iVar3,local_2168,sVar4);
          } while (sVar6 == sVar4);
          sVar4 = 0xffffffffffffffff;
LAB_00110bbc:
          piVar7 = __errno_location();
          iVar1 = *piVar7;
          fchmod(iVar3,(uint)sb.st_nlink & 0x1ff);
          buf[0x1ff8] = (undefined1)sb.st_blocks;
          buf[0x1ff9] = sb.st_blocks._1_1_;
          buf[0x1ffa] = sb.st_blocks._2_1_;
          buf[0x1ffb] = sb.st_blocks._3_1_;
          buf[0x1ffc] = sb.st_blocks._4_1_;
          buf[0x1ffd] = sb.st_blocks._5_1_;
          buf[0x1ffe] = sb.st_blocks._6_1_;
          buf[0x1fff] = sb.st_blocks._7_1_;
          futimens(iVar3,(timespec *)(buf + 0x1ff8));
          close(iVar2);
          close(iVar3);
          if (sVar4 == 0xffffffffffffffff) {
            iVar2 = unlink((char *)sb.__glibc_reserved[2]);
            iVar3 = 0;
            if (iVar2 == -1) {
              pcVar8 = strerror(*piVar7);
              iVar3 = 0;
              ewprintf("Can\'t unlink temp : %s",pcVar8);
            }
          }
          else {
            iVar2 = rename((char *)sb.__glibc_reserved[2],tname);
            iVar3 = 1;
            if (iVar2 == -1) {
              pcVar8 = strerror(*piVar7);
              iVar3 = 0;
              ewprintf("Can\'t rename temp : %s",pcVar8);
              unlink((char *)sb.__glibc_reserved[2]);
            }
          }
          free(tname);
          free((void *)sb.__glibc_reserved[2]);
          *piVar7 = iVar1;
          return iVar3;
        }
        piVar7 = __errno_location();
        iVar3 = *piVar7;
        close(iVar2);
        free(tname);
        free((void *)sb.__glibc_reserved[2]);
        *piVar7 = iVar3;
        goto LAB_00110cf5;
      }
      dobeep();
      piVar7 = __errno_location();
      pcVar5 = strerror(*piVar7);
      ewprintf("Can\'t allocate temp file name : %s",pcVar5);
      free(pcVar8);
      pcVar8 = tname;
    }
    free(pcVar8);
    iVar2 = 2;
  }
  return iVar2;
}

Assistant:

int
fbackupfile(const char *fn)
{
	struct stat	 sb;
	struct timespec	 new_times[2];
	int		 from, to, serrno;
	ssize_t		 nread;
	char		 buf[BUFSIZ];
	char		*nname, *tname, *bkpth;

	if (stat(fn, &sb) == -1) {
		dobeep();
		ewprintf("Can't stat %s : %s", fn, strerror(errno));
		return (FALSE);
	}

	if ((bkpth = bkuplocation(fn)) == NULL)
		return (FALSE);

	if (asprintf(&nname, "%s~", bkpth) == -1) {
		dobeep();
		ewprintf("Can't allocate backup file name : %s", strerror(errno));
		free(bkpth);
		return (ABORT);
	}
	if (asprintf(&tname, "%s.XXXXXXXXXX", bkpth) == -1) {
		dobeep();
		ewprintf("Can't allocate temp file name : %s", strerror(errno));
		free(bkpth);
		free(nname);
		return (ABORT);
	}
	free(bkpth);

	if ((from = open(fn, O_RDONLY)) == -1) {
		free(nname);
		free(tname);
		return (FALSE);
	}
	to = mkstemp(tname);
	if (to == -1) {
		serrno = errno;
		close(from);
		free(nname);
		free(tname);
		errno = serrno;
		return (FALSE);
	}
	while ((nread = read(from, buf, sizeof(buf))) > 0) {
		if (write(to, buf, (size_t)nread) != nread) {
			nread = -1;
			break;
		}
	}
	serrno = errno;
	(void) fchmod(to, (sb.st_mode & 0777));

	/* copy the mtime to the backupfile */
	new_times[0] = sb.st_atim;
	new_times[1] = sb.st_mtim;
	futimens(to, new_times);

	close(from);
	close(to);
	if (nread == -1) {
		if (unlink(tname) == -1)
			ewprintf("Can't unlink temp : %s", strerror(errno));
	} else {
		if (rename(tname, nname) == -1) {
			ewprintf("Can't rename temp : %s", strerror(errno));
			(void) unlink(tname);
			nread = -1;
		}
	}
	free(nname);
	free(tname);
	errno = serrno;

	return (nread == -1 ? FALSE : TRUE);
}